

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O1

void __thiscall
wasm::
CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::
doEndReturn(CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
            *this,RelevantLiveLocalsWalker *self,Expression **currp)

{
  CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
  *this_00;
  CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
  *this_01;
  BasicBlock *__from;
  char *__to;
  char *__to_00;
  BasicBlock *lastExit;
  
  this_00 = (CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
             *)this->exit;
  this_01 = (CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
             *)this->currBasicBlock;
  this->currBasicBlock = (BasicBlock *)0x0;
  if (this_00 ==
      (CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
       *)0x0) {
    this->exit = (BasicBlock *)this_01;
  }
  else {
    if (this->hasSyntheticExit != false) {
      link(this_01,(char *)this_00,(char *)currp);
      return;
    }
    __from = (BasicBlock *)operator_new(0x78);
    (__from->contents).start.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (__from->contents).start.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (__from->contents).start.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (__from->contents).end.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (__from->contents).end.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (__from->contents).end.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (__from->contents).actions.
    super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__from->contents).actions.
    super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__from->contents).actions.
    super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__from->out).
    super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__from->out).
    super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__from->out).
    super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__from->in).
    super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__from->in).
    super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__from->in).
    super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this->exit = __from;
    link(this_00,(char *)__from,__to);
    link(this_01,(char *)this->exit,__to_00);
    this->hasSyntheticExit = true;
  }
  return;
}

Assistant:

static void doEndReturn(SubType* self, Expression** currp) {
    auto* last = self->currBasicBlock;
    self->startUnreachableBlock();
    if (!self->exit) {
      // This is our first exit block and may be our only exit block, so just
      // set it.
      self->exit = last;
    } else if (!self->hasSyntheticExit) {
      // We now have multiple exit blocks, so we need to create a synthetic one.
      // It will be added to the list of basic blocks at the end of the
      // function.
      auto* lastExit = self->exit;
      self->exit = self->makeBasicBlock();
      self->link(lastExit, self->exit);
      self->link(last, self->exit);
      self->hasSyntheticExit = true;
    } else {
      // We already have a synthetic exit block. Just link it up.
      self->link(last, self->exit);
    }
  }